

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::to_visualize_mode(Application *this)

{
  long in_RDI;
  Application *unaff_retaddr;
  undefined1 in_stack_0000000f;
  
  if (*(int *)(in_RDI + 0xc) != 3) {
    DynamicScene::Selection::clear((Selection *)unaff_retaddr);
    set_up_pathtracer(unaff_retaddr);
    PathTracer::stop((PathTracer *)unaff_retaddr);
    PathTracer::start_visualizing(*(PathTracer **)(in_RDI + 0x58));
    *(undefined4 *)(in_RDI + 0xc) = 3;
    setGhosted(this,(bool)in_stack_0000000f);
  }
  return;
}

Assistant:

void Application::to_visualize_mode() {
  if (mode == VISUALIZE_MODE) return;
  scene->selected.clear();
  set_up_pathtracer();
  pathtracer->stop();
  pathtracer->start_visualizing();
  mode = VISUALIZE_MODE;
  setGhosted(false);
}